

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByName(Descriptor *this,string_view name)

{
  ctrl_t *pcVar1;
  FileDescriptorTables *this_00;
  ctrl_t *pcVar2;
  void *pvVar3;
  FieldDescriptor *pFVar4;
  uint uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 *puVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  bool bVar33;
  ushort uVar34;
  uintptr_t v_4;
  undefined8 uVar35;
  size_t sVar36;
  slot_type *psVar37;
  anon_union_8_1_a8a14541_for_iterator_2 aVar38;
  SymbolByParentHash *this_01;
  ParentNameFieldQuery *query;
  ParentNameFieldQuery *extraout_RDX;
  ParentNameFieldQuery *extraout_RDX_00;
  ParentNameFieldQuery *extraout_RDX_01;
  ParentNameFieldQuery *query_00;
  ParentNameFieldQuery *query_01;
  ParentNameFieldQuery *extraout_RDX_02;
  ParentNameFieldQuery *extraout_RDX_03;
  ParentNameFieldQuery *pPVar39;
  uint uVar40;
  value_type *element;
  ulong uVar41;
  undefined8 uVar42;
  Symbol *pSVar43;
  ulong uVar44;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  *prVar45;
  undefined1 uVar46;
  ulong uVar47;
  uint64_t v_3;
  iterator *this_02;
  undefined1 (*pauVar48) [16];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  *unaff_R15;
  size_t cap_2;
  undefined4 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  __m128i match;
  undefined1 auVar52 [16];
  iterator iVar53;
  uintptr_t v;
  uchar *bytes;
  Symbol local_70;
  undefined8 local_68;
  char *local_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  ulong local_38;
  
  local_60 = name._M_str;
  uVar42 = name._M_len;
  this_00 = this->file_->tables_;
  local_58._8_8_ = local_58._0_8_;
  local_58._0_8_ = local_60;
  local_70.ptr_ = &this->super_SymbolBase;
  local_68 = uVar42;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              *)(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   *)&this_00->symbols_by_parent_)->
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  if (1 < (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
             *)&this_00->symbols_by_parent_)->
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    uVar44 = ((ulong)this ^ 0x457a38) * -0x234dd359734ecb13;
    uVar44 = ((uVar44 >> 0x38 | (uVar44 & 0xff000000000000) >> 0x28 |
               (uVar44 & 0xff0000000000) >> 0x18 | (uVar44 & 0xff00000000) >> 8 |
               (uVar44 & 0xff000000) << 8 | (uVar44 & 0xff0000) << 0x18 | (uVar44 & 0xff00) << 0x28
              | uVar44 << 0x38) ^ (ulong)this) * -0x234dd359734ecb13;
    uVar35 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                       (uVar44 >> 0x38 | (uVar44 & 0xff000000000000) >> 0x28 |
                        (uVar44 & 0xff0000000000) >> 0x18 | (uVar44 & 0xff00000000) >> 8 |
                        (uVar44 & 0xff000000) << 8 | (uVar44 & 0xff0000) << 0x18 |
                        (uVar44 & 0xff00) << 0x28 | uVar44 << 0x38,local_58._0_8_,uVar42);
    uVar44 = (uVar35 ^ uVar42) * -0x234dd359734ecb13;
    uVar44 = uVar44 >> 0x38 | (uVar44 & 0xff000000000000) >> 0x28 |
             (uVar44 & 0xff0000000000) >> 0x18 | (uVar44 & 0xff00000000) >> 8 |
             (uVar44 & 0xff000000) << 8 | (uVar44 & 0xff0000) << 0x18 | (uVar44 & 0xff00) << 0x28 |
             uVar44 << 0x38;
    prVar45 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               *)(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)&this_00->symbols_by_parent_)->
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
    if (prVar45 ==
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
         *)0x1) {
      this_01 = (SymbolByParentHash *)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                            *)this_00);
      pSVar43 = &local_70;
      bVar33 = anon_unknown_24::SymbolByParentEq::operator()
                         (*(SymbolByParentEq **)this_01,pSVar43,query_01);
      if ((bVar33) &&
         (sVar36 = (anonymous_namespace)::SymbolByParentHash::operator()(this_01,pSVar43),
         uVar44 != sVar36)) {
LAB_001583bf:
        __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xfbf,
                      "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::AssertHashEqConsistent(const google::protobuf::(anonymous namespace)::ParentNameFieldQuery &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                     );
      }
    }
    else {
      if (prVar45 ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
           *)0x0) goto LAB_0015856a;
      if (prVar45 < (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     *)0x11) {
        unaff_R15 = *(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      **)((long)&(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                    *)&this_00->symbols_by_parent_)->
                                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                 ).
                                 super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                 .value.heap_or_soo_ + 8);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::slot_array(prVar45);
        uVar41 = (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)&this_00->symbols_by_parent_)->
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar48 = (undefined1 (*) [16])
                   (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)&this_00->symbols_by_parent_)->
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                   .value.heap_or_soo_.heap.control;
        if (uVar41 < 0xf) {
          if (8 < uVar41) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          uVar41 = *(ulong *)(*pauVar48 + uVar41) & 0x8080808080808080;
          if (uVar41 != 0x8080808080808080) {
            unaff_R15 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                         *)((long)&unaff_R15[-1].settings_.
                                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                   .
                                   super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                   .value.heap_or_soo_ + 8);
            uVar41 = uVar41 ^ 0x8080808080808080;
            pPVar39 = extraout_RDX;
            do {
              lVar6 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              uVar47 = (ulong)((uint)lVar6 & 0xfffffff8);
              pSVar43 = &local_70;
              bVar33 = anon_unknown_24::SymbolByParentEq::operator()
                                 (*(SymbolByParentEq **)
                                   ((long)&(unaff_R15->settings_).
                                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                           .
                                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                           .value.capacity_ + uVar47),&local_70,pPVar39);
              pPVar39 = extraout_RDX_00;
              if ((bVar33) &&
                 (sVar36 = (anonymous_namespace)::SymbolByParentHash::operator()
                                     ((SymbolByParentHash *)
                                      ((long)&(unaff_R15->settings_).
                                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                              .
                                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                              .value.capacity_ + uVar47),pSVar43),
                 pPVar39 = extraout_RDX_01, uVar44 != sVar36)) goto LAB_001583bf;
              uVar41 = uVar41 & uVar41 - 1;
            } while (uVar41 != 0);
          }
        }
        else {
          uVar41 = (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)&this_00->symbols_by_parent_)->
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                   .value.size_;
          if (1 < uVar41) {
            uVar41 = uVar41 >> 1;
            pPVar39 = extraout_RDX;
            local_48 = uVar42;
            local_38 = uVar41;
            while( true ) {
              auVar50 = *pauVar48;
              uVar40 = (uint)(ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar50[0xf] >> 7) << 0xf);
              if (uVar40 != 0xffff) {
                uVar40 = ~uVar40;
                do {
                  uVar5 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                    }
                  }
                  if ((char)(*pauVar48)[uVar5] < '\0') goto LAB_0015854b;
                  pSVar43 = &local_70;
                  bVar33 = anon_unknown_24::SymbolByParentEq::operator()
                                     ((SymbolByParentEq *)
                                      (&(unaff_R15->settings_).
                                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                        .
                                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                        .value.capacity_)[uVar5],&local_70,pPVar39);
                  pPVar39 = extraout_RDX_02;
                  if ((bVar33) &&
                     (sVar36 = (anonymous_namespace)::SymbolByParentHash::operator()
                                         ((SymbolByParentHash *)
                                          (&(unaff_R15->settings_).
                                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                            .
                                            super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                            .value.capacity_ + uVar5),pSVar43),
                     pPVar39 = extraout_RDX_03, uVar44 != sVar36)) goto LAB_001583bf;
                  uVar41 = uVar41 - 1;
                  uVar34 = (ushort)(uVar40 - 1) & (ushort)uVar40;
                  uVar40 = CONCAT22((short)(uVar40 - 1 >> 0x10),uVar34);
                } while (uVar34 != 0);
              }
              if (uVar41 == 0) break;
              unaff_R15 = unaff_R15 + 4;
              puVar8 = *pauVar48;
              pauVar48 = pauVar48 + 1;
              if (puVar8[0xf] == -1) {
                __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x7a5,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
            }
            uVar42 = local_48;
            if (local_38 <
                (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   *)&this_00->symbols_by_parent_)->
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.size_ >> 1) {
              __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7aa,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
          }
        }
      }
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              *)(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   *)&this_00->symbols_by_parent_)->
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  prVar45 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
             *)(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)&this_00->symbols_by_parent_)->
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
  if (prVar45 ==
      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
       *)0x1) {
    prVar45 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               *)0x1;
    if ((((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
           *)&this_00->symbols_by_parent_)->
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        size_ < 2) goto LAB_001583e2;
    psVar37 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                          *)this_00);
    bVar33 = anon_unknown_24::SymbolByParentEq::operator()
                       ((SymbolByParentEq *)psVar37->ptr_,&local_70,query_00);
    if (!bVar33) {
      prVar45 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                 *)(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)&this_00->symbols_by_parent_)->
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                   .value.capacity_;
      goto LAB_001583e2;
    }
    aVar38.slot_ = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                               *)this_00);
    iVar53.field_1.slot_ = aVar38.slot_;
    iVar53.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
  }
  else {
    if (prVar45 ==
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
         *)0x0) {
LAB_0015856a:
      __assert_fail("cap >= kDefaultCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb75,
                    "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                   );
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
    ::prefetch_heap_block(prVar45);
    uVar44 = ((ulong)this ^ 0x457a38) * -0x234dd359734ecb13;
    uVar44 = ((uVar44 >> 0x38 | (uVar44 & 0xff000000000000) >> 0x28 |
               (uVar44 & 0xff0000000000) >> 0x18 | (uVar44 & 0xff00000000) >> 8 |
               (uVar44 & 0xff000000) << 8 | (uVar44 & 0xff0000) << 0x18 | (uVar44 & 0xff00) << 0x28
              | uVar44 << 0x38) ^ (ulong)this) * -0x234dd359734ecb13;
    uVar35 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                       (uVar44 >> 0x38 | (uVar44 & 0xff000000000000) >> 0x28 |
                        (uVar44 & 0xff0000000000) >> 0x18 | (uVar44 & 0xff00000000) >> 8 |
                        (uVar44 & 0xff000000) << 8 | (uVar44 & 0xff0000) << 0x18 |
                        (uVar44 & 0xff00) << 0x28 | uVar44 << 0x38,local_58._0_8_,uVar42);
    unaff_R15 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                 *)(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)&this_00->symbols_by_parent_)->
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                   .value.capacity_;
    if (unaff_R15 ==
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
         *)0x1) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::ParentNameFieldQuery]"
                   );
    }
    if (unaff_R15 ==
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
         *)0x0) goto LAB_0015856a;
    if (((ulong)((long)&(unaff_R15->settings_).
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_ + 1U) & (ulong)unaff_R15) != 0) {
      __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x14c,
                    "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                   );
    }
    uVar44 = (uVar35 ^ uVar42) * -0x234dd359734ecb13;
    pcVar2 = (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)&this_00->symbols_by_parent_)->
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
             .heap_or_soo_.heap.control;
    uVar41 = (uVar44 >> 0x38 | (uVar44 & 0xff000000000000) >> 0x28 |
              (uVar44 & 0xff0000000000) >> 0x18 | (uVar44 & 0xff00000000) >> 8 |
              (uVar44 & 0xff000000) << 8 | (uVar44 & 0xff0000) << 0x18 | (uVar44 & 0xff00) << 0x28 |
             uVar44 << 0x38) >> 7 ^ (ulong)pcVar2 >> 0xc;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
    ::control(unaff_R15);
    uVar46 = (undefined1)(uVar44 >> 0x38);
    auVar50 = ZEXT216(CONCAT11(uVar46,uVar46) & 0x7f7f);
    auVar50 = pshuflw(auVar50,auVar50,0);
    uVar49 = auVar50._0_4_;
    auVar50._4_4_ = uVar49;
    auVar50._0_4_ = uVar49;
    auVar50._8_4_ = uVar49;
    auVar50._12_4_ = uVar49;
    uVar44 = 0;
    while( true ) {
      uVar41 = uVar41 & (ulong)unaff_R15;
      pcVar1 = pcVar2 + uVar41;
      auVar51[0] = -(auVar50[0] == *pcVar1);
      auVar51[1] = -(auVar50[1] == pcVar1[1]);
      auVar51[2] = -(auVar50[2] == pcVar1[2]);
      auVar51[3] = -(auVar50[3] == pcVar1[3]);
      auVar51[4] = -(auVar50[4] == pcVar1[4]);
      auVar51[5] = -(auVar50[5] == pcVar1[5]);
      auVar51[6] = -(auVar50[6] == pcVar1[6]);
      auVar51[7] = -(auVar50[7] == pcVar1[7]);
      auVar51[8] = -(auVar50[8] == pcVar1[8]);
      auVar51[9] = -(auVar50[9] == pcVar1[9]);
      auVar51[10] = -(auVar50[10] == pcVar1[10]);
      auVar51[0xb] = -(auVar50[0xb] == pcVar1[0xb]);
      auVar51[0xc] = -(auVar50[0xc] == pcVar1[0xc]);
      auVar51[0xd] = -(auVar50[0xd] == pcVar1[0xd]);
      auVar51[0xe] = -(auVar50[0xe] == pcVar1[0xe]);
      auVar51[0xf] = -(auVar50[0xf] == pcVar1[0xf]);
      uVar34 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe | (ushort)(auVar51[0xf] >> 7) << 0xf;
      uVar40 = (uint)uVar34;
      cVar9 = *pcVar1;
      cVar10 = pcVar1[1];
      cVar11 = pcVar1[2];
      cVar12 = pcVar1[3];
      cVar13 = pcVar1[4];
      cVar14 = pcVar1[5];
      cVar15 = pcVar1[6];
      cVar16 = pcVar1[7];
      cVar25 = pcVar1[8];
      cVar26 = pcVar1[9];
      cVar27 = pcVar1[10];
      cVar28 = pcVar1[0xb];
      cVar29 = pcVar1[0xc];
      cVar30 = pcVar1[0xd];
      cVar31 = pcVar1[0xe];
      cVar32 = pcVar1[0xf];
      uVar42 = local_48;
      cVar17 = cStack_40;
      cVar18 = cStack_3f;
      cVar19 = cStack_3e;
      cVar20 = cStack_3d;
      cVar21 = cStack_3c;
      cVar22 = cStack_3b;
      cVar23 = cStack_3a;
      cVar24 = cStack_39;
      local_48 = *(undefined8 *)pcVar1;
      while (cStack_39 = cVar32, cStack_3a = cVar31, cStack_3b = cVar30, cStack_3c = cVar29,
            cStack_3d = cVar28, cStack_3e = cVar27, cStack_3f = cVar26, cStack_40 = cVar25,
            uVar34 != 0) {
        uVar5 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        pvVar3 = (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)&this_00->symbols_by_parent_)->
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.heap_or_soo_.heap.slot_array.p;
        local_58 = auVar50;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                           *)&this_00->symbols_by_parent_)->
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        ).
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_);
        uVar47 = uVar5 + uVar41 & (ulong)unaff_R15;
        bVar33 = anon_unknown_24::SymbolByParentEq::operator()
                           (*(SymbolByParentEq **)((long)pvVar3 + uVar47 * 8),&local_70,query);
        if (bVar33) {
          iVar53 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                  *)this_00,uVar47);
          goto LAB_001583ea;
        }
        uVar34 = (ushort)(uVar40 - 1) & (ushort)uVar40;
        uVar40 = CONCAT22((short)(uVar40 - 1 >> 0x10),uVar34);
        auVar50 = local_58;
        cVar9 = (ctrl_t)local_48;
        cVar10 = local_48._1_1_;
        cVar11 = local_48._2_1_;
        cVar12 = local_48._3_1_;
        cVar13 = local_48._4_1_;
        cVar14 = local_48._5_1_;
        cVar15 = local_48._6_1_;
        cVar16 = local_48._7_1_;
        cVar25 = cStack_40;
        cVar26 = cStack_3f;
        cVar27 = cStack_3e;
        cVar28 = cStack_3d;
        cVar29 = cStack_3c;
        cVar30 = cStack_3b;
        cVar31 = cStack_3a;
        cVar32 = cStack_39;
        uVar42 = local_48;
        cVar17 = cStack_40;
        cVar18 = cStack_3f;
        cVar19 = cStack_3e;
        cVar20 = cStack_3d;
        cVar21 = cStack_3c;
        cVar22 = cStack_3b;
        cVar23 = cStack_3a;
        cVar24 = cStack_39;
      }
      auVar52[0] = -(cVar9 == kEmpty);
      auVar52[1] = -(cVar10 == kEmpty);
      auVar52[2] = -(cVar11 == kEmpty);
      auVar52[3] = -(cVar12 == kEmpty);
      auVar52[4] = -(cVar13 == kEmpty);
      auVar52[5] = -(cVar14 == kEmpty);
      auVar52[6] = -(cVar15 == kEmpty);
      auVar52[7] = -(cVar16 == kEmpty);
      auVar52[8] = -(cStack_40 == kEmpty);
      auVar52[9] = -(cStack_3f == kEmpty);
      auVar52[10] = -(cStack_3e == kEmpty);
      auVar52[0xb] = -(cStack_3d == kEmpty);
      auVar52[0xc] = -(cStack_3c == kEmpty);
      auVar52[0xd] = -(cStack_3b == kEmpty);
      auVar52[0xe] = -(cStack_3a == kEmpty);
      bVar33 = cStack_39 == kEmpty;
      auVar52[0xf] = -bVar33;
      prVar45 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                 *)(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)&this_00->symbols_by_parent_)->
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                   .value.capacity_;
      local_48 = uVar42;
      cStack_40 = cVar17;
      cStack_3f = cVar18;
      cStack_3e = cVar19;
      cStack_3d = cVar20;
      cStack_3c = cVar21;
      cStack_3b = cVar22;
      cStack_3a = cVar23;
      cStack_39 = cVar24;
      if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar52 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar52 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar52 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar52 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar52 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar52 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar52 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar52 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar52 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar52 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar52 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar33) break;
      if (prVar45 ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
           *)0x0) goto LAB_0015856a;
      uVar41 = uVar44 + uVar41 + 0x10;
      uVar44 = uVar44 + 0x10;
      if (prVar45 < uVar44) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::ParentNameFieldQuery]"
                     );
      }
    }
LAB_001583e2:
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
    ::AssertNotDebugCapacity(prVar45);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = unaff_R15;
    iVar53 = (iterator)(auVar7 << 0x40);
  }
LAB_001583ea:
  this_02 = (iterator *)iVar53.ctrl_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              *)(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   *)&this_00->symbols_by_parent_)->
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  bVar33 = absl::lts_20250127::container_internal::operator==
                     ((const_iterator *)this_02,(const_iterator *)iVar53.field_1.slot_);
  if (bVar33) {
    return (FieldDescriptor *)0x0;
  }
  if (this_02 == (iterator *)0x0) {
    FindFieldByName();
  }
  else if (this_02 != (iterator *)(absl::lts_20250127::container_internal::kEmptyGroup + 0x10)) {
    if (-1 < *(char *)&this_02->ctrl_) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::iterator::operator*(this_02);
      pFVar4 = (FieldDescriptor *)((iterator *)&(iVar53.field_1.slot_)->ptr_)->ctrl_;
      if ((pFVar4->super_SymbolBase).symbol_type_ == '\x02') {
        return pFVar4;
      }
      __assert_fail("field != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                    ,0x4c3,
                    "static SymbolT google::protobuf::(anonymous namespace)::ParentNameFieldQuery::IterToSymbol(It) [It = absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::const_iterator]"
                   );
    }
    goto LAB_00158546;
  }
  FindFieldByName();
LAB_00158546:
  FindFieldByName();
LAB_0015854b:
  __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x79d,
                "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
               );
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByName(
    absl::string_view name) const {
  return file()->tables_->FindNestedSymbol<ParentNameFieldQuery>(this, name);
}